

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conditional.cpp
# Opt level: O2

Data * DL::Expressions::and_func(Data *__return_storage_ptr__,vector_t<Data> *args,VM *vm)

{
  pointer pDVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  bool bVar5;
  const_iterator __begin4;
  Data *d;
  allocator local_a1;
  VM *local_a0;
  Data *local_98;
  Data e;
  
  d = (args->super__Vector_base<DL::Data,_std::allocator<DL::Data>_>)._M_impl.
      super__Vector_impl_data._M_start;
  pDVar1 = (args->super__Vector_base<DL::Data,_std::allocator<DL::Data>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  lVar4 = ((long)pDVar1 - (long)d) / 0x60;
  local_a0 = vm;
  if (lVar4 == 0) {
    std::__cxx11::string::string((string *)&e,"",&local_a1);
    Data::Data(__return_storage_ptr__,&e.mKey);
    std::__cxx11::string::~string((string *)&e);
  }
  else if (lVar4 == 1) {
    VM::castTo(__return_storage_ptr__,vm,d,DT_Bool,false);
  }
  else {
    bVar5 = true;
    local_98 = __return_storage_ptr__;
    do {
      if (d == pDVar1) break;
      VM::castTo(&e,local_a0,d,DT_Bool,false);
      bVar3 = false;
      bVar2 = false;
      if ((e.mType != DT_None) && (bVar3 = Data::getBool(&e), bVar2 = bVar5, !bVar3)) {
        bVar2 = false;
      }
      bVar5 = bVar2;
      Data::~Data(&e);
      d = d + 1;
    } while (bVar3 != false);
    std::__cxx11::string::string((string *)&e,"",&local_a1);
    __return_storage_ptr__ = local_98;
    Data::Data(local_98,&e.mKey);
    std::__cxx11::string::~string((string *)&e);
    __return_storage_ptr__->mType = DT_Bool;
    (__return_storage_ptr__->field_2).mBool = bVar5;
  }
  return __return_storage_ptr__;
}

Assistant:

Data and_func(const vector_t<Data>& args, VM& vm)
{
	if (args.size() == 0) {
		return Data();
	} else if (args.size() == 1) {
		return vm.castTo(args.front(), DT_Bool);
	} else {
		bool b = true;

		for (const Data& d : args) {
			Data e = vm.castTo(d, DT_Bool);
			if (!e.isValid() || !e.getBool()) {
				b = false;
				break;
			}
		}

		Data r;
		r.setBool(b);
		return r;
	}
}